

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O1

int pt_tcal_header_cbr(pt_time_cal *tcal,pt_packet_cbr *packet,pt_config *config)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  
  iVar3 = -1;
  if (config != (pt_config *)0x0 && (packet != (pt_packet_cbr *)0x0 && tcal != (pt_time_cal *)0x0))
  {
    if (config->nom_freq == 0) {
      iVar3 = 0;
    }
    else {
      uVar2 = CONCAT71(0,packet->ratio);
      if (uVar2 == 0) {
        iVar3 = -5;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        uVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT116(config->nom_freq) << 8) / auVar1,0);
        tcal->fcr = uVar2;
        if (uVar2 < tcal->min_fcr) {
          tcal->min_fcr = uVar2;
        }
        iVar3 = 0;
        if (tcal->max_fcr < uVar2) {
          tcal->max_fcr = uVar2;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int pt_tcal_header_cbr(struct pt_time_cal *tcal,
		      const struct pt_packet_cbr *packet,
		      const struct pt_config *config)
{
	uint64_t cbr, p1, fcr;

	if (!tcal || !packet || !config)
		return -pte_internal;

	p1 = config->nom_freq;
	if (!p1)
		return 0;

	/* If we know the nominal frequency, we can use it for calibration. */
	cbr = packet->ratio;
	if (!cbr)
		return -pte_bad_packet;

	fcr = (p1 << pt_tcal_fcr_shr) / cbr;

	return pt_tcal_set_fcr(tcal, fcr);
}